

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__reader.cc
# Opt level: O0

void __thiscall
xemmai::io::t_reader::t_reader
          (t_reader *this,t_pvalue *a_stream,wstring_view a_encoding,size_t a_buffer)

{
  t_queue<128UL> *ptVar1;
  t_queue<256UL> *ptVar2;
  char *a_from;
  t_object *ptVar3;
  __pointer_type ptVar4;
  unsigned_long *puVar5;
  wchar_t *pwVar6;
  long *in_FS_OFFSET;
  wstring_view a_string;
  unsigned_long local_110 [3];
  t_reader *local_f8;
  size_t sStack_f0;
  string local_e0;
  size_t local_c0;
  size_t a_buffer_local;
  t_pvalue *a_stream_local;
  t_reader *this_local;
  wstring_view a_encoding_local;
  __pointer_type p_1;
  __pointer_type p;
  
  pwVar6 = a_encoding._M_str;
  this_local = (t_reader *)a_encoding._M_len;
  local_c0 = a_buffer;
  a_buffer_local = (size_t)a_stream;
  a_stream_local = (t_pvalue *)this;
  a_encoding_local._M_len = (size_t)pwVar6;
  t_sharable::t_sharable(&this->super_t_sharable);
  local_f8 = this_local;
  sStack_f0 = a_encoding_local._M_len;
  a_string._M_str = pwVar6;
  a_string._M_len = a_encoding_local._M_len;
  portable::f_convert_abi_cxx11_(&local_e0,(portable *)this_local,a_string);
  a_from = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_e0);
  portable::t_iconv::t_iconv(&this->super_t_iconv,"wchar_t",a_from);
  std::__cxx11::string::~string((string *)&local_e0);
  t_slot::t_slot(&this->v_stream,(t_object *)0x0);
  t_slot::t_slot(&this->v_buffer,(t_object *)0x0);
  this->v_n0 = 0;
  this->v_p1 = (char *)&this->v_c;
  this->v_n1 = 4;
  ptVar3 = t_pointer::operator_cast_to_t_object_((t_pointer *)a_buffer_local);
  if ((t_object *)0x4 < ptVar3) {
    ptVar1 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
    *ptVar1->v_head = ptVar3;
    if (ptVar1->v_head == ptVar1->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar1);
    }
    else {
      ptVar1->v_head = ptVar1->v_head + 1;
    }
  }
  ptVar4 = std::atomic<xemmai::t_object_*>::exchange(&(this->v_stream).v_p,ptVar3,relaxed);
  if ((__pointer_type)0x4 < ptVar4) {
    ptVar2 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
    *ptVar2->v_head = ptVar4;
    if (ptVar2->v_head == ptVar2->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar2);
    }
    else {
      ptVar2->v_head = ptVar2->v_head + 1;
    }
  }
  local_110[0] = 1;
  puVar5 = std::max<unsigned_long>(&local_c0,local_110);
  ptVar3 = t_bytes::f_instantiate(*puVar5);
  if ((t_object *)0x4 < ptVar3) {
    ptVar1 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
    *ptVar1->v_head = ptVar3;
    if (ptVar1->v_head == ptVar1->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar1);
    }
    else {
      ptVar1->v_head = ptVar1->v_head + 1;
    }
  }
  a_encoding_local._M_str =
       (wchar_t *)std::atomic<xemmai::t_object_*>::exchange(&(this->v_buffer).v_p,ptVar3,relaxed);
  if ((__pointer_type)0x4 < a_encoding_local._M_str) {
    ptVar2 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
    *ptVar2->v_head = (t_object *)a_encoding_local._M_str;
    if (ptVar2->v_head == ptVar2->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar2);
    }
    else {
      ptVar2->v_head = ptVar2->v_head + 1;
    }
  }
  return;
}

Assistant:

t_reader::t_reader(const t_pvalue& a_stream, std::wstring_view a_encoding, size_t a_buffer) : t_iconv("wchar_t", portable::f_convert(a_encoding).c_str())
{
	v_stream = a_stream;
	v_buffer = t_bytes::f_instantiate(std::max(a_buffer, size_t(1)));
}